

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::popStackFrame(VirtualMachine *this)

{
  undefined1 local_68 [8];
  shared_ptr<runtime::StackFrame> currentFrame;
  undefined1 local_38 [8];
  shared_ptr<runtime::StackFrame> outer;
  
  std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)local_68,
             &(this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  if (local_68 == (undefined1  [8])0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &currentFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,"No current stack frame found!",(allocator<char> *)local_38);
    panic(this,(string *)
               &currentFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)local_38,
             (__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_68 + 0x28));
  if (local_38 != (undefined1  [8])0x0) {
    std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->stackFrame).
                super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&outer);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&currentFrame);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &currentFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,"No outer stack frame found!",
             (allocator<char> *)
             ((long)&outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  panic(this,(string *)
             &currentFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
}

Assistant:

void runtime::VirtualMachine::popStackFrame() {
  auto currentFrame = this->stackFrame;

  if (currentFrame == nullptr) {
    this->panic("No current stack frame found!");
    return;
  }

  auto outer = currentFrame->outer;

  if (outer == nullptr) {
    this->panic("No outer stack frame found!");
    return;
  }

  this->stackFrame = outer;
}